

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

void invdisp_nothing(char *hdr,char *txt)

{
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  nh_menuitem items [3];
  char *txt_local;
  char *hdr_local;
  
  _item_._0_4_ = 0;
  _item_._4_4_ = 2;
  items[0].caption[0xf8] = '\0';
  items[0].caption[0xf9] = '\0';
  items[0].caption[0xfa] = '\0';
  strcpy((char *)items,hdr);
  items[0].caption[0xfc] = '\0';
  items[0].caption[0xfd] = '\0';
  items[0].caption[0xfe] = '\0';
  items[0].caption[0xff] = '\0';
  items[0].accel = '\x01';
  items[0].group_accel = '\0';
  items[0].selected = '\0';
  items[0]._267_1_ = 0;
  items[1].caption[0xf8] = '\0';
  items[1].caption[0xf9] = '\0';
  items[1].caption[0xfa] = '\0';
  strcpy((char *)(items + 1),"");
  items[1].caption[0xfc] = '\0';
  items[1].caption[0xfd] = '\0';
  items[1].caption[0xfe] = '\0';
  items[1].caption[0xff] = '\0';
  items[1].accel = '\x01';
  items[1].group_accel = '\0';
  items[1].selected = '\0';
  items[1]._267_1_ = 0;
  items[2].caption[0xf8] = '\0';
  items[2].caption[0xf9] = '\0';
  items[2].caption[0xfa] = '\0';
  strcpy((char *)(items + 2),txt);
  display_menu((nh_menuitem *)&_item_,3,(char *)0x0,0,(int *)0x0);
  return;
}

Assistant:

static void invdisp_nothing(const char *hdr, const char *txt)
{
	struct nh_menuitem items[3];
	
	set_menuitem(&items[0], 0, MI_HEADING, hdr, 0, FALSE);
	set_menuitem(&items[1], 0, MI_NORMAL, "", 0, FALSE);
	set_menuitem(&items[2], 0, MI_NORMAL, txt, 0, FALSE);
	
	display_menu(items, 3, NULL, PICK_NONE, NULL);
	
	return;
}